

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThriftSender.h
# Opt level: O0

void __thiscall jaegertracing::ThriftSender::~ThriftSender(ThriftSender *this)

{
  ThriftSender *this_local;
  
  (this->super_Sender)._vptr_Sender = (_func_int **)&PTR__ThriftSender_004fa368;
  (*(this->super_Sender)._vptr_Sender[4])();
  std::shared_ptr<apache::thrift::transport::TMemoryBuffer>::~shared_ptr(&this->_thriftBuffer);
  std::
  unique_ptr<apache::thrift::protocol::TProtocolFactory,_std::default_delete<apache::thrift::protocol::TProtocolFactory>_>
  ::~unique_ptr(&this->_protocolFactory);
  thrift::Process::~Process(&this->_process);
  std::vector<jaegertracing::thrift::Span,_std::allocator<jaegertracing::thrift::Span>_>::~vector
            (&this->_spanBuffer);
  std::
  unique_ptr<jaegertracing::utils::Transport,_std::default_delete<jaegertracing::utils::Transport>_>
  ::~unique_ptr(&this->_transporter);
  Sender::~Sender(&this->super_Sender);
  return;
}

Assistant:

~ThriftSender() { close(); }